

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index i,Index j)

{
  bool bVar1;
  Index IVar2;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *pPVar3;
  Scalar *__a;
  Scalar *__b;
  PermutationMatrix<_1,__1,_int> *pPVar4;
  Index j_local;
  Index i_local;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this_local;
  
  bVar1 = false;
  if ((-1 < i) && (bVar1 = false, -1 < j)) {
    IVar2 = size(this);
    bVar1 = false;
    if (i < IVar2) {
      IVar2 = size(this);
      bVar1 = j < IVar2;
    }
  }
  if (!bVar1) {
    __assert_fail("i>=0 && j>=0 && i<size() && j<size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/PermutationMatrix.h"
                  ,0xc0,
                  "Derived &Eigen::PermutationBase<Eigen::PermutationMatrix<-1, -1>>::applyTranspositionOnTheRight(Index, Index) [Derived = Eigen::PermutationMatrix<-1, -1>]"
                 );
  }
  pPVar3 = &indices(this)->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
  __a = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeffRef(pPVar3,(long)i);
  pPVar3 = &indices(this)->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
  __b = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeffRef(pPVar3,(long)j);
  std::swap<int>(__a,__b);
  pPVar4 = EigenBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::derived
                     ((EigenBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)this);
  return pPVar4;
}

Assistant:

Derived& applyTranspositionOnTheRight(Index i, Index j)
    {
      eigen_assert(i>=0 && j>=0 && i<size() && j<size());
      std::swap(indices().coeffRef(i), indices().coeffRef(j));
      return derived();
    }